

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall google::protobuf::Message::MergeFrom(Message *this,Message *from)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Message MStack_28;
  long lVar2;
  
  iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[4])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  iVar1 = (*(from->super_MessageLite)._vptr_MessageLite[4])(from);
  if ((lVar2 != 0) && (lVar2 == CONCAT44(extraout_var_00,iVar1))) {
    if (*(char *)(lVar2 + 0x3c) != '\x01') {
      (**(code **)(lVar2 + 0x20))(this,from);
      return;
    }
    MergeFrom(&MStack_28);
  }
  protobuf::internal::ReflectionOps::Merge(from,this);
  return;
}

Assistant:

void Message::MergeFrom(const Message& from) {
  auto* class_to = GetClassData();
  auto* class_from = from.GetClassData();
  if (class_to == nullptr || class_to != class_from) {
    ReflectionOps::Merge(from, this);
  } else {
    class_to->full().merge_to_from(*this, from);
  }
}